

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

SectionTracker * Catch::TestCaseTracking::SectionTracker::acquire(TrackerContext *ctx,string *name)

{
  ITracker *parent;
  int iVar1;
  TrackerBase *in_RAX;
  undefined4 extraout_var;
  TrackerBase *this;
  int __oflag;
  string *psVar2;
  string *__file;
  _Alloc_hider local_28;
  
  __file = (string *)&local_28;
  parent = ctx->m_currentTracker;
  psVar2 = name;
  local_28._M_p = (pointer)in_RAX;
  iVar1 = (*(parent->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
            _vptr_NonCopyable[0xe])(parent);
  this = (TrackerBase *)CONCAT44(extraout_var,iVar1);
  if (this == (TrackerBase *)0x0) {
    this = (TrackerBase *)operator_new(0x60);
    SectionTracker((SectionTracker *)this,name,ctx,parent);
    local_28._M_p = (pointer)this;
    (*(((TrackerBase *)&this->super_ITracker)->super_ITracker).super_SharedImpl<Catch::IShared>.
      super_IShared.super_NonCopyable._vptr_NonCopyable[2])(this);
    (*(parent->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [0xd])(parent);
    Ptr<Catch::TestCaseTracking::ITracker>::~Ptr
              ((Ptr<Catch::TestCaseTracking::ITracker> *)&local_28);
  }
  else {
    iVar1 = (*(this->super_ITracker).super_SharedImpl<Catch::IShared>.super_IShared.
              super_NonCopyable._vptr_NonCopyable[0x10])(this);
    __file = psVar2;
    if ((char)iVar1 == '\0') {
      __assert_fail("childTracker->isSectionTracker()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AxelStrem[P]local_ptr/test/catch.hpp"
                    ,0x1653,
                    "static SectionTracker &Catch::TestCaseTracking::SectionTracker::acquire(TrackerContext &, const std::string &)"
                   );
    }
  }
  if (ctx->m_runState != CompletedCycle) {
    iVar1 = (*(this->super_ITracker).super_SharedImpl<Catch::IShared>.super_IShared.
              super_NonCopyable._vptr_NonCopyable[5])(this);
    if ((char)iVar1 == '\0') {
      TrackerBase::open(this,(char *)__file,__oflag);
    }
  }
  return (SectionTracker *)this;
}

Assistant:

static SectionTracker& acquire( TrackerContext& ctx, std::string const& name ) {
            SectionTracker* section = CATCH_NULL;

            ITracker& currentTracker = ctx.currentTracker();
            if( ITracker* childTracker = currentTracker.findChild( name ) ) {
                assert( childTracker );
                assert( childTracker->isSectionTracker() );
                section = static_cast<SectionTracker*>( childTracker );
            }
            else {
                section = new SectionTracker( name, ctx, &currentTracker );
                currentTracker.addChild( section );
            }
            if( !ctx.completedCycle() && !section->isComplete() ) {

                section->open();
            }
            return *section;
        }